

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O3

Vec_Int_t *
Iso_ManFindMapping(Aig_Man_t *pAig1,Aig_Man_t *pAig2,Vec_Int_t *vPerm1_,Vec_Int_t *vPerm2_,
                  int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *vMap2to1;
  ulong uVar6;
  int *__s;
  long lVar7;
  int *piVar8;
  ulong uVar9;
  Vec_Int_t *vInvPerm2;
  Vec_Int_t *local_70;
  Vec_Int_t *local_60;
  size_t local_58;
  int *local_50;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  if ((((pAig1->nObjs[2] == pAig2->nObjs[2]) && (pAig1->nObjs[3] == pAig2->nObjs[3])) &&
      (pAig1->nRegs == pAig2->nRegs)) &&
     (pAig1->nObjs[6] + pAig1->nObjs[5] == pAig2->nObjs[6] + pAig2->nObjs[5])) {
    iVar3 = Aig_ManLevelNum(pAig1);
    iVar4 = Aig_ManLevelNum(pAig2);
    if (iVar3 == iVar4) {
      if (fVerbose != 0) {
        puts("AIG1:");
      }
      local_70 = vPerm1_;
      if (vPerm1_ == (Vec_Int_t *)0x0) {
        local_70 = Saig_ManFindIsoPerm(pAig1,fVerbose);
      }
      if (fVerbose != 0) {
        puts("AIG1:");
      }
      pVVar5 = vPerm2_;
      if (vPerm2_ == (Vec_Int_t *)0x0) {
        pVVar5 = Saig_ManFindIsoPerm(pAig2,fVerbose);
      }
      if ((vPerm1_ != (Vec_Int_t *)0x0) && (vPerm1_->nSize != pAig1->nObjs[2])) {
        __assert_fail("Vec_IntSize(vPerm1_) == Aig_ManCiNum(pAig1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                      ,0x121,
                      "Vec_Int_t *Iso_ManFindMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      local_38 = vPerm1_;
      if ((vPerm2_ != (Vec_Int_t *)0x0) && (vPerm2_->nSize != pAig2->nObjs[2])) {
        __assert_fail("Vec_IntSize(vPerm2_) == Aig_ManCiNum(pAig2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                      ,0x123,
                      "Vec_Int_t *Iso_ManFindMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      local_40 = vPerm2_;
      vMap2to1 = (Vec_Int_t *)calloc(1,0x10);
      uVar2 = pVVar5->nSize;
      uVar9 = (ulong)uVar2;
      local_48 = pVVar5;
      local_60 = vMap2to1;
      if (uVar9 != 0) {
        piVar8 = pVVar5->pArray;
        iVar3 = *piVar8;
        if (1 < (int)uVar2) {
          uVar6 = 1;
          do {
            if (iVar3 <= piVar8[uVar6]) {
              iVar3 = piVar8[uVar6];
            }
            uVar6 = uVar6 + 1;
          } while (uVar9 != uVar6);
        }
        uVar1 = iVar3 + 1;
        if (iVar3 < 0) {
          __s = (int *)0x0;
        }
        else {
          local_58 = (ulong)uVar1 << 2;
          local_50 = piVar8;
          __s = (int *)malloc(local_58);
          vMap2to1->pArray = __s;
          if (__s == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          vMap2to1->nCap = uVar1;
          memset(__s,0xff,local_58);
          piVar8 = local_50;
        }
        vMap2to1->nSize = uVar1;
        if (0 < (int)uVar2) {
          uVar6 = 0;
          do {
            uVar2 = piVar8[uVar6];
            if ((ulong)uVar2 != 0xffffffff) {
              if (((int)uVar2 < 0) || (iVar3 < (int)uVar2)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              __s[uVar2] = (int)uVar6;
            }
            uVar6 = uVar6 + 1;
          } while (uVar9 != uVar6);
        }
        if (-1 < iVar3) {
          lVar7 = 0;
          do {
            iVar3 = __s[lVar7];
            if (((long)iVar3 < 0) || (pAig1->nObjs[2] <= iVar3)) {
              __assert_fail("Entry >= 0 && Entry < Aig_ManCiNum(pAig1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                            ,0x129,
                            "Vec_Int_t *Iso_ManFindMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                           );
            }
            if (local_70->nSize <= iVar3) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            __s[lVar7] = local_70->pArray[iVar3];
            lVar7 = lVar7 + 1;
          } while (lVar7 < vMap2to1->nSize);
        }
      }
      if (local_38 == (Vec_Int_t *)0x0) {
        Vec_IntFree(local_70);
      }
      if (local_40 == (Vec_Int_t *)0x0) {
        Vec_IntFree(local_48);
      }
      iVar3 = Iso_ManCheckMapping(pAig1,pAig2,vMap2to1,fVerbose);
      if (iVar3 != 0) {
        return vMap2to1;
      }
      Vec_IntFreeP(&local_60);
      return local_60;
    }
  }
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Iso_ManFindMapping( Aig_Man_t * pAig1, Aig_Man_t * pAig2, Vec_Int_t * vPerm1_, Vec_Int_t * vPerm2_, int fVerbose )
{
    Vec_Int_t * vPerm1, * vPerm2, * vInvPerm2;
    int i, Entry;
    if ( Aig_ManCiNum(pAig1) != Aig_ManCiNum(pAig2) )
        return NULL;
    if ( Aig_ManCoNum(pAig1) != Aig_ManCoNum(pAig2) )
        return NULL;
    if ( Aig_ManRegNum(pAig1) != Aig_ManRegNum(pAig2) )
        return NULL;
    if ( Aig_ManNodeNum(pAig1) != Aig_ManNodeNum(pAig2) )
        return NULL;
    if ( Aig_ManLevelNum(pAig1) != Aig_ManLevelNum(pAig2) )
        return NULL;
//    if ( Iso_ManNegEdgeNum(pAig1) != Iso_ManNegEdgeNum(pAig2) )
//        return NULL;
//    s_Counter++;

    if ( fVerbose ) 
        printf( "AIG1:\n" );
    vPerm1 = vPerm1_ ? vPerm1_ : Saig_ManFindIsoPerm( pAig1, fVerbose );
    if ( fVerbose )
        printf( "AIG1:\n" );
    vPerm2 = vPerm2_ ? vPerm2_ : Saig_ManFindIsoPerm( pAig2, fVerbose );
    if ( vPerm1_ )
        assert( Vec_IntSize(vPerm1_) == Aig_ManCiNum(pAig1) );
    if ( vPerm2_ )
        assert( Vec_IntSize(vPerm2_) == Aig_ManCiNum(pAig2) );
    // find canonical permutation
    // vPerm1/vPerm2 give canonical order of CIs of AIG1/AIG2
    vInvPerm2 = Vec_IntInvert( vPerm2, -1 );
    Vec_IntForEachEntry( vInvPerm2, Entry, i )
    {
        assert( Entry >= 0 && Entry < Aig_ManCiNum(pAig1) );
        Vec_IntWriteEntry( vInvPerm2, i, Vec_IntEntry(vPerm1, Entry) );
    }
    if ( vPerm1_ == NULL )
        Vec_IntFree( vPerm1 );
    if ( vPerm2_ == NULL )
        Vec_IntFree( vPerm2 );
    // check if they are indeed equivalent
    if ( !Iso_ManCheckMapping( pAig1, pAig2, vInvPerm2, fVerbose ) )
        Vec_IntFreeP( &vInvPerm2 );
    return vInvPerm2;
}